

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliFindLongestMatch
               (ZopfliBlockState *s,ZopfliHash *h,uchar *array,size_t pos,size_t size,size_t limit,
               unsigned_short *sublen,unsigned_short *distance,unsigned_short *length)

{
  ushort uVar1;
  ZopfliLongestMatchCache *pZVar2;
  bool bVar3;
  long *plVar4;
  unsigned_short uVar5;
  uint uVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  unsigned_short uVar12;
  long *plVar13;
  size_t sVar14;
  unsigned_short *puVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long *plVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long *plVar24;
  bool bVar25;
  bool bVar26;
  uint local_74;
  unsigned_short *local_48;
  int *local_40;
  
  sVar14 = pos - s->blockstart;
  pZVar2 = s->lmc;
  if (pZVar2 == (ZopfliLongestMatchCache *)0x0) {
    bVar26 = false;
  }
  else if (pZVar2->length[sVar14] == 0) {
    bVar26 = true;
  }
  else {
    bVar26 = pZVar2->dist[sVar14] != 0;
  }
  local_40 = h->head;
  local_48 = h->prev;
  iVar20 = h->val;
  if (bVar26) {
    bVar25 = true;
    if ((limit == 0x102) || (pZVar2->length[sVar14] <= limit)) goto LAB_00125556;
    if (sublen != (unsigned_short *)0x0) {
      uVar6 = ZopfliMaxCachedSublen(pZVar2,sVar14,(ulong)pZVar2->length[sVar14]);
      bVar25 = limit <= uVar6;
      goto LAB_00125556;
    }
  }
  bVar25 = false;
LAB_00125556:
  pZVar2 = s->lmc;
  bVar3 = true;
  if ((bool)(bVar26 & bVar25 & pZVar2 != (ZopfliLongestMatchCache *)0x0)) {
    if ((sublen == (unsigned_short *)0x0) ||
       (uVar8 = pZVar2->length[sVar14], uVar6 = ZopfliMaxCachedSublen(pZVar2,sVar14,(ulong)uVar8),
       uVar8 <= uVar6)) {
      pZVar2 = s->lmc;
      uVar8 = (ushort)limit;
      if (pZVar2->length[sVar14] <= limit) {
        uVar8 = pZVar2->length[sVar14];
      }
      *length = uVar8;
      if (sublen == (unsigned_short *)0x0) {
        puVar15 = pZVar2->dist + sVar14;
      }
      else {
        ZopfliCacheToSublen(pZVar2,sVar14,(ulong)*length,sublen);
        puVar15 = sublen + *length;
      }
      *distance = *puVar15;
      bVar3 = false;
    }
    else {
      limit = (size_t)s->lmc->length[sVar14];
    }
  }
  if (bVar3) {
    if (size - pos < 3) {
      *length = 0;
      *distance = 0;
    }
    else {
      uVar6 = (uint)pos & 0x7fff;
      uVar16 = size - pos;
      if (limit + pos <= size) {
        uVar16 = limit;
      }
      plVar13 = (long *)(array + pos);
      uVar8 = *(ushort *)(local_40 + iVar20);
      uVar1 = local_48[uVar8];
      uVar21 = (ulong)uVar1;
      uVar9 = (uint)uVar8 - (uint)uVar1;
      uVar22 = uVar9 + 0x8000;
      if ((uint)uVar1 <= (uint)uVar8 && uVar9 != 0) {
        uVar22 = uVar9;
      }
      uVar18 = (ulong)uVar22;
      iVar20 = 0x2000;
      uVar23 = 1;
      local_74 = 0;
      do {
        uVar17 = (uint)uVar18;
        uVar22 = (uint)uVar23;
        uVar9 = uVar22;
        if (0x7fff < uVar17) break;
        if (uVar17 == 0) {
LAB_001257ee:
          uVar9 = uVar22;
          if (((local_40 != h->head2) && (h->same[uVar6] <= (ushort)uVar9)) &&
             (h->val2 == h->hashval2[uVar21])) {
            local_48 = h->prev2;
            local_40 = h->head2;
          }
          uVar8 = local_48[uVar21];
          if (uVar8 == (ushort)uVar21) {
            bVar26 = false;
            uVar21 = (ulong)uVar8;
          }
          else {
            iVar10 = (int)uVar21 - (uint)uVar8;
            iVar7 = iVar10 + 0x8000;
            if (uVar8 < (ushort)uVar21) {
              iVar7 = iVar10;
            }
            uVar18 = (ulong)(uVar17 + iVar7);
            bVar26 = 1 < iVar20;
            uVar21 = (ulong)uVar8;
            iVar20 = iVar20 + -1;
          }
        }
        else {
          plVar19 = (long *)(array + (pos - uVar18));
          uVar11 = uVar23 & 0xffff;
          if ((pos + uVar11 < size) &&
             (*(char *)((long)plVar13 + uVar11) != *(char *)((long)plVar19 + uVar11))) {
            uVar9 = 0;
          }
          else {
            uVar8 = h->same[uVar6];
            plVar24 = plVar13;
            if ((2 < uVar8) && ((char)*plVar13 == (char)*plVar19)) {
              uVar1 = h->same[(uint)(pos - uVar18) & 0x7fff];
              if (uVar1 <= uVar8) {
                uVar8 = uVar1;
              }
              uVar9 = (uint)uVar8;
              if (uVar16 < uVar9) {
                uVar9 = (uint)uVar16;
              }
              plVar19 = (long *)((long)plVar19 + (ulong)(uVar9 & 0xffff));
              plVar24 = (long *)((long)plVar13 + (ulong)(uVar9 & 0xffff));
            }
            for (; (plVar4 = plVar24, plVar24 < (long *)((uVar16 - 8) + (long)plVar13) &&
                   (*plVar24 == *plVar19)); plVar24 = plVar24 + 1) {
              plVar19 = plVar19 + 1;
            }
            for (; (plVar4 != (long *)((long)plVar13 + uVar16) &&
                   (plVar24 = plVar4, (char)*plVar4 == (char)*plVar19));
                plVar4 = (long *)((long)plVar4 + 1)) {
              plVar19 = (long *)((long)plVar19 + 1);
              plVar24 = (long *)((long)plVar13 + uVar16);
            }
            uVar9 = (int)plVar24 - (int)plVar13;
          }
          if ((ushort)uVar9 <= (ushort)uVar23) goto LAB_001257ee;
          if (sublen != (unsigned_short *)0x0) {
            uVar22 = uVar22 + 1;
            do {
              sublen[uVar22 & 0xffff] = (unsigned_short)uVar18;
              uVar22 = uVar22 + 1;
            } while ((ushort)uVar22 <= (ushort)uVar9);
          }
          uVar22 = uVar9;
          local_74 = uVar17;
          if ((uVar9 & 0xffff) < uVar16) goto LAB_001257ee;
          bVar26 = false;
        }
        uVar23 = (ulong)uVar9;
      } while (bVar26);
      uVar8 = (ushort)uVar9;
      sVar14 = pos - s->blockstart;
      pZVar2 = s->lmc;
      if (pZVar2 == (ZopfliLongestMatchCache *)0x0) {
        bVar26 = false;
      }
      else if (pZVar2->length[sVar14] == 0) {
        bVar26 = true;
      }
      else {
        bVar26 = pZVar2->dist[sVar14] != 0;
      }
      if (((sublen != (unsigned_short *)0x0) && (uVar16 == 0x102)) &&
         ((pZVar2 != (ZopfliLongestMatchCache *)0x0 && (!bVar26)))) {
        uVar12 = (unsigned_short)local_74;
        if (uVar8 < 3) {
          uVar12 = 0;
        }
        uVar5 = 0;
        if (uVar8 >= 3) {
          uVar5 = uVar8;
        }
        pZVar2->dist[sVar14] = uVar12;
        pZVar2->length[sVar14] = uVar5;
        ZopfliSublenToCache(sublen,sVar14,(ulong)(uVar9 & 0xffff),pZVar2);
      }
      *distance = (unsigned_short)local_74;
      *length = uVar8;
    }
  }
  return;
}

Assistant:

void ZopfliFindLongestMatch(ZopfliBlockState* s, const ZopfliHash* h,
    const unsigned char* array,
    size_t pos, size_t size, size_t limit,
    unsigned short* sublen, unsigned short* distance, unsigned short* length) {
  unsigned short hpos = pos & ZOPFLI_WINDOW_MASK, p, pp;
  unsigned short bestdist = 0;
  unsigned short bestlength = 1;
  const unsigned char* scan;
  const unsigned char* match;
  const unsigned char* arrayend;
  const unsigned char* arrayend_safe;
#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
  int chain_counter = ZOPFLI_MAX_CHAIN_HITS;  /* For quitting early. */
#endif

  unsigned dist = 0;  /* Not unsigned short on purpose. */

  int* hhead = h->head;
  unsigned short* hprev = h->prev;
  int* hhashval = h->hashval;
  int hval = h->val;

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  if (TryGetFromLongestMatchCache(s, pos, &limit, sublen, distance, length)) {
    assert(pos + *length <= size);
    return;
  }
#endif

  assert(limit <= ZOPFLI_MAX_MATCH);
  assert(limit >= ZOPFLI_MIN_MATCH);
  assert(pos < size);

  if (size - pos < ZOPFLI_MIN_MATCH) {
    /* The rest of the code assumes there are at least ZOPFLI_MIN_MATCH bytes to
       try. */
    *length = 0;
    *distance = 0;
    return;
  }

  if (pos + limit > size) {
    limit = size - pos;
  }
  arrayend = &array[pos] + limit;
  arrayend_safe = arrayend - 8;

  assert(hval < 65536);

  pp = hhead[hval];  /* During the whole loop, p == hprev[pp]. */
  p = hprev[pp];

  assert(pp == hpos);

  dist = p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

  /* Go through all distances. */
  while (dist < ZOPFLI_WINDOW_SIZE) {
    unsigned short currentlength = 0;

    assert(p < ZOPFLI_WINDOW_SIZE);
    assert(p == hprev[pp]);
    assert(hhashval[p] == hval);

    if (dist > 0) {
      assert(pos < size);
      assert(dist <= pos);
      scan = &array[pos];
      match = &array[pos - dist];

      /* Testing the byte at position bestlength first, goes slightly faster. */
      if (pos + bestlength >= size
          || *(scan + bestlength) == *(match + bestlength)) {

#ifdef ZOPFLI_HASH_SAME
        unsigned short same0 = h->same[pos & ZOPFLI_WINDOW_MASK];
        if (same0 > 2 && *scan == *match) {
          unsigned short same1 = h->same[(pos - dist) & ZOPFLI_WINDOW_MASK];
          unsigned short same = same0 < same1 ? same0 : same1;
          if (same > limit) same = limit;
          scan += same;
          match += same;
        }
#endif
        scan = GetMatch(scan, match, arrayend, arrayend_safe);
        currentlength = scan - &array[pos];  /* The found length. */
      }

      if (currentlength > bestlength) {
        if (sublen) {
          unsigned short j;
          for (j = bestlength + 1; j <= currentlength; j++) {
            sublen[j] = dist;
          }
        }
        bestdist = dist;
        bestlength = currentlength;
        if (currentlength >= limit) break;
      }
    }


#ifdef ZOPFLI_HASH_SAME_HASH
    /* Switch to the other hash once this will be more efficient. */
    if (hhead != h->head2 && bestlength >= h->same[hpos] &&
        h->val2 == h->hashval2[p]) {
      /* Now use the hash that encodes the length and first byte. */
      hhead = h->head2;
      hprev = h->prev2;
      hhashval = h->hashval2;
      hval = h->val2;
    }
#endif

    pp = p;
    p = hprev[p];
    if (p == pp) break;  /* Uninited prev value. */

    dist += p < pp ? pp - p : ((ZOPFLI_WINDOW_SIZE - p) + pp);

#if ZOPFLI_MAX_CHAIN_HITS < ZOPFLI_WINDOW_SIZE
    chain_counter--;
    if (chain_counter <= 0) break;
#endif
  }

#ifdef ZOPFLI_LONGEST_MATCH_CACHE
  StoreInLongestMatchCache(s, pos, limit, sublen, bestdist, bestlength);
#endif

  assert(bestlength <= limit);

  *distance = bestdist;
  *length = bestlength;
  assert(pos + *length <= size);
}